

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O0

void __thiscall
midi_container::serialize_as_stream
          (midi_container *this,unsigned_long subsong,
          vector<midi_stream_event,_std::allocator<midi_stream_event>_> *p_stream,
          system_exclusive_table *p_system_exclusive,unsigned_long *loop_start,
          unsigned_long *loop_end,uint clean_flags)

{
  pointer *ppbVar1;
  pointer *this_00;
  value_type vVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  reference pvVar6;
  const_reference pvVar7;
  midi_event *pmVar8;
  long lVar9;
  const_reference pvVar10;
  char *pcVar11;
  char *pcVar12;
  reference pvVar13;
  byte *pbVar14;
  unsigned_long uVar15;
  reference this_01;
  midi_stream_event local_200;
  uint local_1ec;
  size_type sStack_1e8;
  uint32_t event_code_1;
  unsigned_long j_3;
  unsigned_long i_5;
  char *local_1d0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b8;
  uchar *local_1b0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a8;
  size_type local_1a0;
  unsigned_long _data_count;
  uint local_184;
  size_type sStack_180;
  uint32_t system_exclusive_index;
  unsigned_long j_2;
  unsigned_long i_4;
  size_t data_count;
  uint local_154;
  size_type sStack_150;
  uint32_t event_code;
  unsigned_long j_1;
  unsigned_long i_3;
  unsigned_long timestamp_ms;
  midi_event *event_2;
  unsigned_long tempo_track;
  midi_event *event_1;
  bool filtered;
  ulong uStack_118;
  uint i_2;
  size_t next_track;
  unsigned_long next_timestamp;
  unsigned_long i_1;
  midi_event *event;
  const_reference pvStack_f0;
  uint j;
  midi_track *track;
  uint local_e0;
  byte local_dc;
  byte local_db;
  undefined1 local_da;
  bool skip_track;
  uint i;
  bool clean_banks;
  bool clean_instruments;
  bool clean_emidi;
  size_type local_d0;
  unsigned_long local_loop_end;
  unsigned_long local_loop_start;
  unsigned_long tick_loop_end;
  unsigned_long local_a8;
  unsigned_long tick_loop_start;
  size_t track_count;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  device_names;
  vector<unsigned_char,_std::allocator<unsigned_char>_> port_numbers;
  vector<unsigned_long,_std::allocator<unsigned_long>_> track_positions;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  unsigned_long *loop_end_local;
  unsigned_long *loop_start_local;
  system_exclusive_table *p_system_exclusive_local;
  vector<midi_stream_event,_std::allocator<midi_stream_event>_> *p_stream_local;
  unsigned_long subsong_local;
  midi_container *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &device_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&track_count);
  tick_loop_start = std::vector<midi_track,_std::allocator<midi_track>_>::size(&this->m_tracks);
  local_a8 = get_timestamp_loop_start(this,subsong,false);
  local_loop_start = get_timestamp_loop_end(this,subsong,false);
  local_loop_end = 0xffffffffffffffff;
  local_d0 = 0xffffffffffffffff;
  _i = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,tick_loop_start,(value_type_conflict2 *)&i)
  ;
  skip_track = false;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &device_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,tick_loop_start,&skip_track);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&track_count,tick_loop_start);
  local_da = (clean_flags & 1) != 0;
  local_db = (clean_flags & 2) != 0;
  local_dc = (clean_flags & 4) != 0;
  if ((bool)local_da) {
    for (local_e0 = 0; local_e0 < tick_loop_start; local_e0 = local_e0 + 1) {
      track._7_1_ = 0;
      pvStack_f0 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                             (&this->m_tracks,(ulong)local_e0);
      for (event._4_4_ = 0; uVar4 = (ulong)event._4_4_, sVar5 = midi_track::get_count(pvStack_f0),
          uVar4 < sVar5; event._4_4_ = event._4_4_ + 1) {
        i_1 = (unsigned_long)midi_track::operator[](pvStack_f0,(ulong)event._4_4_);
        if ((((((midi_event *)i_1)->m_type == control_change) &&
             (((midi_event *)i_1)->m_data[0] == 'n')) && (((midi_event *)i_1)->m_data[1] != '\0'))
           && ((((midi_event *)i_1)->m_data[1] != '\x01' &&
               (((midi_event *)i_1)->m_data[1] != '\x7f')))) {
          track._7_1_ = 1;
          break;
        }
      }
      if ((track._7_1_ & 1) != 0) {
        sVar5 = midi_track::get_count(pvStack_f0);
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &port_numbers.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_e0);
        *pvVar6 = sVar5;
      }
    }
  }
  if (this->m_form == 2) {
    for (next_timestamp = 0; next_timestamp < tick_loop_start; next_timestamp = next_timestamp + 1)
    {
      if (next_timestamp != subsong) {
        pvVar7 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                           (&this->m_tracks,next_timestamp);
        sVar5 = midi_track::get_count(pvVar7);
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &port_numbers.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,next_timestamp);
        *pvVar6 = sVar5;
      }
    }
  }
  do {
    next_track = 0xffffffffffffffff;
    uStack_118 = 0;
    for (event_1._4_4_ = 0; event_1._4_4_ < tick_loop_start; event_1._4_4_ = event_1._4_4_ + 1) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &port_numbers.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(ulong)event_1._4_4_);
      uVar4 = *pvVar6;
      pvVar7 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                         (&this->m_tracks,(ulong)event_1._4_4_);
      sVar5 = midi_track::get_count(pvVar7);
      if (uVar4 < sVar5) {
        pvVar7 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                           (&this->m_tracks,(ulong)event_1._4_4_);
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &port_numbers.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)event_1._4_4_)
        ;
        pmVar8 = midi_track::operator[](pvVar7,*pvVar6);
        if (pmVar8->m_timestamp < next_track) {
          pvVar7 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                             (&this->m_tracks,(ulong)event_1._4_4_);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &port_numbers.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (ulong)event_1._4_4_);
          pmVar8 = midi_track::operator[](pvVar7,*pvVar6);
          next_track = pmVar8->m_timestamp;
          uStack_118 = (ulong)event_1._4_4_;
        }
      }
    }
    if (next_track == 0xffffffffffffffff) {
      *loop_start = local_loop_end;
      *loop_end = local_d0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&track_count);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &device_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &port_numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &track_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    event_1._3_1_ = 0;
    if (((local_db & 1) != 0) || ((local_dc & 1) != 0)) {
      pvVar7 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                         (&this->m_tracks,uStack_118);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &port_numbers.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,uStack_118);
      tempo_track = (unsigned_long)midi_track::operator[](pvVar7,*pvVar6);
      if (((local_db & 1) == 0) || (((midi_event *)tempo_track)->m_type != program_change)) {
        if ((((local_dc & 1) != 0) && (((midi_event *)tempo_track)->m_type == control_change)) &&
           ((((midi_event *)tempo_track)->m_data[0] == '\0' ||
            (((midi_event *)tempo_track)->m_data[0] == ' ')))) {
          event_1._3_1_ = 1;
        }
      }
      else {
        event_1._3_1_ = 1;
      }
    }
    if ((event_1._3_1_ & 1) == 0) {
      event_2 = (midi_event *)0x0;
      if ((this->m_form == 2) && (subsong != 0)) {
        event_2 = (midi_event *)subsong;
      }
      pvVar7 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                         (&this->m_tracks,uStack_118);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &port_numbers.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,uStack_118);
      timestamp_ms = (unsigned_long)midi_track::operator[](pvVar7,*pvVar6);
      if ((local_loop_end == 0xffffffffffffffff) &&
         (local_a8 <= ((midi_event *)timestamp_ms)->m_timestamp)) {
        local_loop_end =
             std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::size(p_stream);
      }
      if ((local_d0 == 0xffffffffffffffff) && (local_loop_start < *(ulong *)timestamp_ms)) {
        local_d0 = std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::size
                             (p_stream);
      }
      i_3 = timestamp_to_ms(this,*(unsigned_long *)timestamp_ms,(unsigned_long)event_2);
      if (*(int *)(timestamp_ms + 8) == 7) {
        i_4 = midi_event::get_data_count((midi_event *)timestamp_ms);
        if ((i_4 < 3) || (*(char *)(timestamp_ms + 0x18) != -0x10)) {
          if ((i_4 < 3) || (*(char *)(timestamp_ms + 0x18) != -1)) {
            if ((i_4 == 1) && (0xf7 < *(byte *)(timestamp_ms + 0x18))) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&track_count,uStack_118);
              lVar9 = std::__cxx11::string::length();
              if (lVar9 != 0) {
                j_3 = 0;
                pvVar10 = std::
                          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ::operator[](&this->m_device_names,(ulong)*(uint *)(timestamp_ms + 0xc));
                sStack_1e8 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size(pvVar10);
                for (; j_3 < sStack_1e8; j_3 = j_3 + 1) {
                  pvVar10 = std::
                            vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ::operator[](&this->m_device_names,(ulong)*(uint *)(timestamp_ms + 0xc))
                  ;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](pvVar10,j_3);
                  pcVar11 = (char *)std::__cxx11::string::c_str();
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&track_count,uStack_118);
                  pcVar12 = (char *)std::__cxx11::string::c_str();
                  iVar3 = strcmp(pcVar11,pcVar12);
                  if (iVar3 == 0) break;
                }
                vVar2 = (value_type)j_3;
                ppbVar1 = &device_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     ppbVar1,uStack_118);
                *pvVar13 = vVar2;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&track_count,uStack_118);
                std::__cxx11::string::clear();
                pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     ppbVar1,uStack_118);
                limit_port_number<unsigned_char>(this,pvVar13);
              }
              pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &device_names.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,uStack_118);
              local_1ec = (uint)*pbVar14 * 0x1000000 + (uint)*(byte *)(timestamp_ms + 0x18);
              midi_stream_event::midi_stream_event(&local_200,i_3,local_1ec);
              std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::push_back
                        (p_stream,&local_200);
            }
          }
          else if ((*(char *)(timestamp_ms + 0x19) == '\x04') ||
                  (*(char *)(timestamp_ms + 0x19) == '\t')) {
            uVar15 = midi_event::get_data_count((midi_event *)timestamp_ms);
            local_1a0 = uVar15 - 2;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &track_positions.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,local_1a0);
            uVar15 = timestamp_ms;
            pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &track_positions.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,0);
            midi_event::copy_data((midi_event *)uVar15,pvVar13,2,local_1a0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&track_count,uStack_118);
            std::__cxx11::string::clear();
            this_01 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&track_count,uStack_118);
            this_00 = &track_positions.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            local_1a8._M_current =
                 (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     this_00);
            local_1b8._M_current =
                 (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     this_00);
            local_1b0 = (uchar *)__gnu_cxx::
                                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 ::operator+(&local_1b8,local_1a0);
            std::__cxx11::string::
            assign<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((string *)this_01,local_1a8,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_1b0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&track_count,uStack_118);
            local_1c0._M_current = (char *)std::__cxx11::string::begin();
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&track_count,uStack_118);
            local_1c8._M_current = (char *)std::__cxx11::string::end();
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&track_count,uStack_118);
            local_1d0 = (char *)std::__cxx11::string::begin();
            i_5 = (unsigned_long)
                  std::
                  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                            (local_1c0,local_1c8,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )local_1d0,tolower);
          }
          else if (*(char *)(timestamp_ms + 0x19) == '!') {
            vVar2 = *(value_type *)(timestamp_ms + 0x1a);
            ppbVar1 = &device_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppbVar1,
                                 uStack_118);
            *pvVar13 = vVar2;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&track_count,uStack_118);
            std::__cxx11::string::clear();
            pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppbVar1,
                                 uStack_118);
            limit_port_number<unsigned_char>(this,pvVar13);
          }
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&track_count,uStack_118);
          lVar9 = std::__cxx11::string::length();
          if (lVar9 != 0) {
            j_2 = 0;
            pvVar10 = std::
                      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator[](&this->m_device_names,(ulong)*(uint *)(timestamp_ms + 0xc));
            sStack_180 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(pvVar10);
            for (; j_2 < sStack_180; j_2 = j_2 + 1) {
              pvVar10 = std::
                        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ::operator[](&this->m_device_names,(ulong)*(uint *)(timestamp_ms + 0xc));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](pvVar10,j_2);
              pcVar11 = (char *)std::__cxx11::string::c_str();
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&track_count,uStack_118);
              pcVar12 = (char *)std::__cxx11::string::c_str();
              iVar3 = strcmp(pcVar11,pcVar12);
              if (iVar3 == 0) break;
            }
            vVar2 = (value_type)j_2;
            ppbVar1 = &device_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppbVar1,
                                 uStack_118);
            *pvVar13 = vVar2;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&track_count,uStack_118);
            std::__cxx11::string::clear();
            pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppbVar1,
                                 uStack_118);
            limit_port_number<unsigned_char>(this,pvVar13);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &track_positions.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,i_4);
          uVar15 = timestamp_ms;
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &track_positions.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,0);
          midi_event::copy_data((midi_event *)uVar15,pvVar13,0,i_4);
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &track_positions.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,i_4 - 1);
          if (*pvVar13 == 0xf7) {
            pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &track_positions.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,0);
            uVar15 = i_4;
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &device_names.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,uStack_118);
            local_184 = system_exclusive_table::add_entry
                                  (p_system_exclusive,pvVar13,uVar15,(ulong)*pbVar14);
            midi_stream_event::midi_stream_event
                      ((midi_stream_event *)&_data_count,i_3,local_184 | 0x80000000);
            std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::push_back
                      (p_stream,(value_type *)&_data_count);
          }
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&track_count,uStack_118);
        lVar9 = std::__cxx11::string::length();
        if (lVar9 != 0) {
          j_1 = 0;
          pvVar10 = std::
                    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator[](&this->m_device_names,(ulong)*(uint *)(timestamp_ms + 0xc));
          sStack_150 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(pvVar10);
          for (; j_1 < sStack_150; j_1 = j_1 + 1) {
            pvVar10 = std::
                      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator[](&this->m_device_names,(ulong)*(uint *)(timestamp_ms + 0xc));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](pvVar10,j_1);
            pcVar11 = (char *)std::__cxx11::string::c_str();
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&track_count,uStack_118);
            pcVar12 = (char *)std::__cxx11::string::c_str();
            iVar3 = strcmp(pcVar11,pcVar12);
            if (iVar3 == 0) break;
          }
          vVar2 = (value_type)j_1;
          ppbVar1 = &device_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppbVar1,
                               uStack_118);
          *pvVar13 = vVar2;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&track_count,uStack_118);
          std::__cxx11::string::clear();
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppbVar1,
                               uStack_118);
          limit_port_number<unsigned_char>(this,pvVar13);
        }
        local_154 = (*(int *)(timestamp_ms + 8) + 8) * 0x10 + *(int *)(timestamp_ms + 0xc);
        if (*(long *)(timestamp_ms + 0x10) != 0) {
          local_154 = (uint)*(byte *)(timestamp_ms + 0x18) * 0x100 + local_154;
        }
        if (1 < *(ulong *)(timestamp_ms + 0x10)) {
          local_154 = (uint)*(byte *)(timestamp_ms + 0x19) * 0x10000 + local_154;
        }
        pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &device_names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,uStack_118);
        local_154 = local_154 + (uint)*pbVar14 * 0x1000000;
        midi_stream_event::midi_stream_event((midi_stream_event *)&data_count,i_3,local_154);
        std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::push_back
                  (p_stream,(value_type *)&data_count);
      }
    }
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &port_numbers.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,uStack_118);
    *pvVar6 = *pvVar6 + 1;
  } while( true );
}

Assistant:

void midi_container::serialize_as_stream( unsigned long subsong,
                                          std::vector<midi_stream_event> & p_stream,
                                          system_exclusive_table & p_system_exclusive,
                                          unsigned long & loop_start,
                                          unsigned long & loop_end,
                                          unsigned clean_flags ) const
{
    std::vector<uint8_t> data;
    std::vector<std::size_t> track_positions;
    std::vector<uint8_t> port_numbers;
    std::vector<std::string> device_names;
    std::size_t track_count = m_tracks.size();

    unsigned long tick_loop_start = get_timestamp_loop_start(subsong);
    unsigned long tick_loop_end = get_timestamp_loop_end(subsong);
    unsigned long local_loop_start = ~0UL;
    unsigned long local_loop_end = ~0UL;

    track_positions.resize( track_count, 0 );
    port_numbers.resize( track_count, 0 );
    device_names.resize( track_count );

    bool clean_emidi = !!( clean_flags & clean_flag_emidi );
    bool clean_instruments = !!( clean_flags & clean_flag_instruments );
    bool clean_banks = !!( clean_flags & clean_flag_banks );

    if ( clean_emidi )
    {
        for ( unsigned i = 0; i < track_count; ++i )
        {
            bool skip_track = false;
            const midi_track & track = m_tracks[ i ];
            for ( unsigned j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change &&
                     event.m_data[ 0 ] == 110 )
                {
                    if ( event.m_data[ 1 ] != 0 && event.m_data[ 1 ] != 1 && event.m_data[ 1 ] != 127 )
                    {
                        skip_track = true;
                        break;
                    }
                }
            }
            if ( skip_track )
            {
                track_positions[ i ] = track.get_count();
            }
        }
    }

    if ( m_form == 2 )
    {
        for ( unsigned long i = 0; i < track_count; ++i )
        {
            if ( i != subsong ) track_positions[ i ] = m_tracks[ i ].get_count();
        }
    }

    for (;;)
    {
        unsigned long next_timestamp = ~0UL;
        std::size_t next_track = 0;
        for ( unsigned i = 0; i < track_count; ++i )
        {
            if ( track_positions[ i ] >= m_tracks[ i ].get_count() ) continue;
            if ( m_tracks[ i ][ track_positions[ i ] ].m_timestamp < next_timestamp )
            {
                next_timestamp = m_tracks[ i ][ track_positions[ i ] ].m_timestamp;
                next_track = i;
            }
        }
        if ( next_timestamp == ~0UL ) break;

        bool filtered = false;

        if ( clean_instruments || clean_banks )
        {
            const midi_event & event = m_tracks[ next_track ][ track_positions[ next_track ] ];
            if ( clean_instruments && event.m_type == midi_event::program_change ) filtered = true;
            else if ( clean_banks && event.m_type == midi_event::control_change &&
                ( event.m_data[ 0 ] == 0x00 || event.m_data[ 0 ] == 0x20 ) ) filtered = true;
        }

        if ( !filtered )
        {
            unsigned long tempo_track = 0;
            if ( m_form == 2 && subsong ) tempo_track = subsong;

            const midi_event & event = m_tracks[ next_track ][ track_positions[ next_track ] ];

            if ( local_loop_start == ~0UL && event.m_timestamp >= tick_loop_start )
                local_loop_start = p_stream.size();
            if ( local_loop_end == ~0UL && event.m_timestamp > tick_loop_end )
                local_loop_end = p_stream.size();

            unsigned long timestamp_ms = timestamp_to_ms( event.m_timestamp, tempo_track );
            if ( event.m_type != midi_event::extended )
            {
                if ( device_names[ next_track ].length() )
                {
                    unsigned long i, j;
                    for ( i = 0, j = m_device_names[ event.m_channel ].size(); i < j; ++i )
                    {
                        if ( !strcmp( m_device_names[ event.m_channel ][ i ].c_str(), device_names[ next_track ].c_str() ) ) break;
                    }
                    port_numbers[ next_track ] = (uint8_t) i;
                    device_names[ next_track ].clear();
                    limit_port_number( port_numbers[ next_track ] );
                }

                uint32_t event_code = ( ( event.m_type + 8 ) << 4 ) + event.m_channel;
                if ( event.m_data_count >= 1 ) event_code += event.m_data[ 0 ] << 8;
                if ( event.m_data_count >= 2 ) event_code += event.m_data[ 1 ] << 16;
                event_code += port_numbers[ next_track ] << 24;
                p_stream.push_back( midi_stream_event( timestamp_ms, event_code ) );
            }
            else
            {
                std::size_t data_count = event.get_data_count();
                if ( data_count >= 3 && event.m_data[ 0 ] == 0xF0 )
                {
                    if ( device_names[ next_track ].length() )
                    {
                        unsigned long i, j;
                        for ( i = 0, j = m_device_names[ event.m_channel ].size(); i < j; ++i )
                        {
                            if ( !strcmp( m_device_names[ event.m_channel ][ i ].c_str(), device_names[ next_track ].c_str() ) ) break;
                        }
                        port_numbers[ next_track ] = (uint8_t) i;
                        device_names[ next_track ].clear();
                        limit_port_number( port_numbers[ next_track ] );
                    }

                    data.resize( data_count );
                    event.copy_data( &data[0], 0, data_count );
                    if ( data[ data_count - 1 ] == 0xF7 )
                    {
                        uint32_t system_exclusive_index = p_system_exclusive.add_entry( &data[0], data_count, port_numbers[ next_track ] );
                        p_stream.push_back( midi_stream_event( timestamp_ms, system_exclusive_index | 0x80000000 ) );
                    }
                }
                else if ( data_count >= 3 && event.m_data[ 0 ] == 0xFF )
                {
                    if ( event.m_data[ 1 ] == 4 || event.m_data[ 1 ] == 9 )
                    {
                        unsigned long _data_count = event.get_data_count() - 2;
                        data.resize( _data_count );
                        event.copy_data( &data[0], 2, _data_count );
                        device_names[ next_track ].clear();
                        device_names[ next_track ].assign( data.begin(), data.begin() + _data_count );
                        std::transform( device_names[ next_track ].begin(), device_names[ next_track ].end(), device_names[ next_track ].begin(), ::tolower );
                    }
                    else if ( event.m_data[ 1 ] == 0x21 )
                    {
                        port_numbers[ next_track ] = event.m_data[ 2 ];
                        device_names[ next_track ].clear();
                        limit_port_number( port_numbers[ next_track ] );
                    }
                }
                else if ( data_count == 1 && event.m_data[ 0 ] >= 0xF8 )
                {
                    if ( device_names[ next_track ].length() )
                    {
                        unsigned long i, j;
                        for ( i = 0, j = m_device_names[ event.m_channel ].size(); i < j; ++i )
                        {
                            if ( !strcmp( m_device_names[ event.m_channel ][ i ].c_str(), device_names[ next_track ].c_str() ) ) break;
                        }
                        port_numbers[ next_track ] = (uint8_t) i;
                        device_names[ next_track ].clear();
                        limit_port_number( port_numbers[ next_track ] );
                    }

                    uint32_t event_code = port_numbers[ next_track ] << 24;
                    event_code += event.m_data[ 0 ];
                    p_stream.push_back( midi_stream_event( timestamp_ms, event_code ) );
                }
            }
        }

        track_positions[ next_track ]++;
    }

    loop_start = local_loop_start;
    loop_end = local_loop_end;
}